

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lifo.h
# Opt level: O2

void __thiscall density::lifo_array<MyStruct>::lifo_array(lifo_array<MyStruct> *this,size_t i_size)

{
  undefined8 *puVar1;
  MyStruct *pMVar2;
  long lVar3;
  ulong uVar4;
  
  pMVar2 = (MyStruct *)detail::ThreadLifoAllocator<0>::allocate(i_size << 5);
  (this->super_LifoArrayImpl<MyStruct,_false>).m_elements = pMVar2;
  (this->super_LifoArrayImpl<MyStruct,_false>).m_size = i_size;
  lVar3 = 0;
  for (uVar4 = 0; uVar4 < i_size; uVar4 = uVar4 + 1) {
    pMVar2 = (this->super_LifoArrayImpl<MyStruct,_false>).m_elements;
    puVar1 = (undefined8 *)
             ((long)&(pMVar2->m_other_strings).
                     super_LifoArrayImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                     .m_elements + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&(pMVar2->m_strings).
                     super_LifoArrayImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                     .m_elements + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    lifo_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    lifo_array((lifo_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)((long)&(pMVar2->m_strings).
                          super_LifoArrayImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                          .m_elements + lVar3),6);
    lifo_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    lifo_array((lifo_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)((long)&(pMVar2->m_other_strings).
                          super_LifoArrayImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                          .m_elements + lVar3),6);
    i_size = (this->super_LifoArrayImpl<MyStruct,_false>).m_size;
    lVar3 = lVar3 + 0x20;
  }
  return;
}

Assistant:

lifo_array(size_t i_size) : detail::LifoArrayImpl<TYPE>(i_size)
        {
            default_construct(std::is_pod<TYPE>());
        }